

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

int __thiscall pstore::file::file_handle::open(file_handle *this,char *__file,int __oflag,...)

{
  int *piVar1;
  int in_ECX;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar3 = (int)__file;
  close(this,iVar3);
  this->is_writable_ = __oflag == 1;
  uVar4 = (uint)(__oflag == 1) * 2;
  if (iVar3 == 2) {
    uVar4 = uVar4 | 0x40;
  }
  else if (iVar3 == 0) {
    uVar4 = uVar4 | 0xc0;
  }
  uVar2 = 0x124;
  if (__oflag == 1) {
    uVar2 = 0x1b6;
  }
  uVar4 = ::open((this->path_)._M_dataplus._M_p,uVar4,uVar2);
  piVar1 = (int *)(ulong)uVar4;
  this->file_ = uVar4;
  if (uVar4 == 0xffffffff) {
    piVar1 = __errno_location();
    iVar3 = *piVar1;
    if ((in_ECX != 0) || (iVar3 != 2)) {
      std::__cxx11::string::string((string *)&local_40,(string *)&this->path_);
      (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
                (iVar3,"Unable to open",&local_40);
    }
    this->file_ = -1;
  }
  return (int)piVar1;
}

Assistant:

void file_handle::open (create_mode const create, writable_mode const writable,
                                present_mode const present) {
            this->close ();

            is_writable_ = writable == writable_mode::read_write;

            int oflag = is_writable_ ? O_RDWR : O_RDONLY;
            switch (create) {
            // Creates a new file, only if it does not already exist
            case create_mode::create_new:
                // NOLINTNEXTLINE(hicpp-signed-bitwise)
                oflag |= O_CREAT | O_EXCL;
                break;
            // Opens a file only if it already exists
            case create_mode::open_existing: break;
            // Opens an existing file if present, and creates a new file otherwise.
            case create_mode::open_always:
                // NOLINTNEXTLINE(hicpp-signed-bitwise)
                oflag |= O_CREAT;
                break;
            }

            // user, group, and others have read permission.
            // NOLINTNEXTLINE(hicpp-signed-bitwise)
            mode_t pmode = S_IRUSR | S_IRGRP | S_IROTH;
            if (is_writable_) {
                // user, group, and others have read and write permission.
                // NOLINTNEXTLINE(hicpp-signed-bitwise)
                pmode |= S_IWUSR | S_IWGRP | S_IWOTH;
            }

            file_ = ::open (path_.c_str (), oflag, pmode); // NOLINT
            if (file_ == -1) {
                int const err = errno;
                if (present == present_mode::allow_not_found && err == ENOENT) {
                    file_ = -1;
                } else {
                    raise_file_error (err, "Unable to open", path_);
                }
            }
        }